

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::framebufferTextureLayer
          (ReferenceContext *this,deUint32 target,deUint32 attachment,deUint32 texture,int level,
          int layer)

{
  Type TVar1;
  Framebuffer *pFVar2;
  Framebuffer *pFVar3;
  Framebuffer *pFVar4;
  Texture *pTVar5;
  TexTarget TVar6;
  Framebuffer **ppFVar7;
  long lVar8;
  int iVar9;
  Attachment *attachment_00;
  int iVar10;
  bool bVar11;
  
  if ((int)attachment < 0x8d00) {
    if (attachment == 0x821a) {
      (*(this->super_Context)._vptr_Context[0x1f])
                (this,(ulong)target,0x8d00,(ulong)texture,(ulong)(uint)level,(ulong)(uint)layer);
      (*(this->super_Context)._vptr_Context[0x1f])
                (this,(ulong)target,0x8d20,(ulong)texture,(ulong)(uint)level,(ulong)(uint)layer);
      return;
    }
    if (attachment == 0x8ce0) {
      bVar11 = false;
      lVar8 = 0;
    }
    else {
LAB_008273de:
      lVar8 = 3;
      bVar11 = true;
    }
  }
  else {
    if (attachment == 0x8d00) {
      lVar8 = 1;
    }
    else {
      if (attachment != 0x8d20) goto LAB_008273de;
      lVar8 = 2;
    }
    bVar11 = false;
  }
  if (((1 < target - 0x8ca8) && (target != 0x8d40)) || (bVar11)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  ppFVar7 = &this->m_readFramebufferBinding;
  if (target == 0x8ca9) {
    ppFVar7 = &this->m_drawFramebufferBinding;
  }
  if (target == 0x8d40) {
    ppFVar7 = &this->m_drawFramebufferBinding;
  }
  pFVar2 = *ppFVar7;
  if (pFVar2 == (Framebuffer *)0x0) {
LAB_008275d9:
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  pFVar3 = this->m_drawFramebufferBinding;
  pFVar4 = this->m_readFramebufferBinding;
  if (texture == 0) {
    pTVar5 = (Texture *)0x0;
LAB_0082750b:
    attachment_00 = pFVar2->m_attachments + lVar8;
    iVar9 = (uint)(pFVar2 == pFVar4) + (uint)(pFVar2 == pFVar3);
    for (iVar10 = iVar9; iVar10 != 0; iVar10 = iVar10 + -1) {
      releaseFboAttachmentReference(this,attachment_00);
    }
    attachment_00->type = ATTACHMENTTYPE_LAST;
    attachment_00->name = 0;
    pFVar2->m_attachments[lVar8].texTarget = TEXTARGET_LAST;
    pFVar2->m_attachments[lVar8].level = 0;
    pFVar2->m_attachments[lVar8].layer = 0;
    if (pTVar5 != (Texture *)0x0) {
      attachment_00->type = ATTACHMENTTYPE_TEXTURE;
      pFVar2->m_attachments[lVar8].name = (pTVar5->super_NamedObject).m_name;
      TVar6 = TEXTARGET_LAST;
      if (pTVar5->m_type - TYPE_2D_ARRAY < 3) {
        TVar6 = pTVar5->m_type + TYPE_3D;
      }
      pFVar2->m_attachments[lVar8].texTarget = TVar6;
      pFVar2->m_attachments[lVar8].level = level;
      pFVar2->m_attachments[lVar8].layer = layer;
      for (; iVar9 != 0; iVar9 = iVar9 + -1) {
        acquireFboAttachmentReference(this,attachment_00);
      }
    }
  }
  else {
    pTVar5 = rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,texture);
    if (pTVar5 == (Texture *)0x0) goto LAB_008275d9;
    if (level == 0) {
      TVar1 = pTVar5->m_type;
      if (2 < TVar1 - TYPE_2D_ARRAY) goto LAB_008275d9;
      if (TVar1 == TYPE_CUBE_MAP_ARRAY) {
LAB_008275d0:
        bVar11 = (uint)layer < 0x88ff;
      }
      else {
        if (TVar1 != TYPE_3D) {
          if (TVar1 != TYPE_2D_ARRAY) goto LAB_0082750b;
          goto LAB_008275d0;
        }
        bVar11 = (uint)layer < 0x8073;
      }
      if (bVar11) goto LAB_0082750b;
    }
    if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  return;
}

Assistant:

void ReferenceContext::framebufferTextureLayer (deUint32 target, deUint32 attachment, deUint32 texture, int level, int layer)
{
	if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
	{
		// Attach to both depth and stencil.
		framebufferTextureLayer(target, GL_DEPTH_ATTACHMENT,	texture, level, layer);
		framebufferTextureLayer(target, GL_STENCIL_ATTACHMENT,	texture, level, layer);
	}
	else
	{
		Framebuffer::AttachmentPoint	point			= mapGLAttachmentPoint(attachment);
		Texture*						texObj			= DE_NULL;

		RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
					target != GL_DRAW_FRAMEBUFFER	&&
					target != GL_READ_FRAMEBUFFER,				GL_INVALID_ENUM,		RC_RET_VOID);
		RC_IF_ERROR(point == Framebuffer::ATTACHMENTPOINT_LAST,	GL_INVALID_ENUM,		RC_RET_VOID);

		// Select binding point.
		rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;
		RC_IF_ERROR(!framebufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);

		// If framebuffer object is bound for both reading and writing then we need to acquire/release multiple references.
		int bindingRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
							+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

		if (texture != 0)
		{
			texObj = m_textures.find(texture);

			RC_IF_ERROR(!texObj,		GL_INVALID_OPERATION,	RC_RET_VOID);
			RC_IF_ERROR(level != 0,		GL_INVALID_VALUE,		RC_RET_VOID); // \todo [2012-03-19 pyry] We should allow other levels as well.

			RC_IF_ERROR(texObj->getType() != Texture::TYPE_2D_ARRAY			&&
						texObj->getType() != Texture::TYPE_3D				&&
						texObj->getType() != Texture::TYPE_CUBE_MAP_ARRAY,				GL_INVALID_OPERATION,	RC_RET_VOID);

			if (texObj->getType() == Texture::TYPE_2D_ARRAY || texObj->getType() == Texture::TYPE_CUBE_MAP_ARRAY)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_ARRAY_TEXTURE_LAYERS),		GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
			else if	(texObj->getType() == Texture::TYPE_3D)
			{
				RC_IF_ERROR((layer < 0) || (layer >= GL_MAX_3D_TEXTURE_SIZE),				GL_INVALID_VALUE,		RC_RET_VOID);
				RC_IF_ERROR((level < 0) || (level > deFloatLog2(GL_MAX_3D_TEXTURE_SIZE)),	GL_INVALID_VALUE,		RC_RET_VOID);
			}
		}

		Framebuffer::Attachment& fboAttachment = framebufferBinding->getAttachment(point);
		for (int ndx = 0; ndx < bindingRefCount; ndx++)
			releaseFboAttachmentReference(fboAttachment);
		fboAttachment = Framebuffer::Attachment();

		if (texObj)
		{
			fboAttachment.type			= Framebuffer::ATTACHMENTTYPE_TEXTURE;
			fboAttachment.name			= texObj->getName();
			fboAttachment.texTarget		= texLayeredTypeToTarget(texObj->getType());
			fboAttachment.level			= level;
			fboAttachment.layer			= layer;

			DE_ASSERT(fboAttachment.texTarget != Framebuffer::TEXTARGET_LAST);

			for (int ndx = 0; ndx < bindingRefCount; ndx++)
				acquireFboAttachmentReference(fboAttachment);
		}
	}
}